

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

void Curl_freeset(Curl_easy *data)

{
  undefined1 *puVar1;
  byte bVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    (*Curl_cfree)((data->set).str[lVar3]);
    (data->set).str[lVar3] = (char *)0x0;
  }
  bVar2 = (data->change).field_0x20;
  if ((bVar2 & 2) != 0) {
    (*Curl_cfree)((data->change).referer);
    bVar2 = (data->change).field_0x20 & 0xfd;
    (data->change).field_0x20 = bVar2;
  }
  (data->change).referer = (char *)0x0;
  if ((bVar2 & 1) != 0) {
    (*Curl_cfree)((data->change).url);
    puVar1 = &(data->change).field_0x20;
    *puVar1 = *puVar1 & 0xfe;
  }
  (data->change).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;
  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}